

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O2

duckdb_logical_type duckdb_vector_get_column_type(duckdb_vector vector)

{
  LogicalType *this;
  
  if (vector == (duckdb_vector)0x0) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this,(LogicalType *)(vector + 8));
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_vector_get_column_type(duckdb_vector vector) {
	if (!vector) {
		return nullptr;
	}
	auto v = reinterpret_cast<duckdb::Vector *>(vector);
	return reinterpret_cast<duckdb_logical_type>(new duckdb::LogicalType(v->GetType()));
}